

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void reportError(Error error)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  int local_40;
  int i;
  string local_30 [8];
  string line;
  Error error_local;
  
  line.field_2._12_4_ = error;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_7408);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nextToken.lineNo.row + 1);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_741e);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nextToken.lineNo.col);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_7434);
  pmVar2 = std::
           map<Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Error>,_std::allocator<std::pair<const_Error,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&errorTable_abi_cxx11_,(key_type *)(line.field_2._M_local_buf + 0xc));
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_30);
  std::ios::clear(file + *(long *)(*(long *)file + -0x18),0);
  std::istream::seekg((long)file,_S_beg);
  for (local_40 = nextToken.lineNo.row; 0 < local_40; local_40 = local_40 + -1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(file,local_30);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(file,local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ios::fill((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ios_base::width
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
             (long)(nextToken.lineNo.col + -1));
  poVar1 = std::operator<<((ostream *)&std::cout,"~~~~~~^");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  system("pause");
  exit(0);
}

Assistant:

void reportError(Error error)
{
    cout<<endl<<"行"<<nextToken.lineNo.row+1<<" 列"<<nextToken.lineNo.col<<" 出现错误:"<<errorTable[error]<<endl<<endl;
    string line;
    file->clear();
    file->seekg(0,ios::beg);
    for(int i=nextToken.lineNo.row;i>0;i--)
        getline(*file,line);
    cout<<line<<endl;
    getline(*file,line);
    cout<<line<<endl;
    cout.fill(' ');
    cout.width(nextToken.lineNo.col-1);
    cout<<"~~~~~~^"<<endl;
    system("pause");
    exit(0);
}